

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# book.cpp
# Opt level: O0

bool getLine(char *buff,int *buff_p,string *line)

{
  int iVar1;
  string *in_RDX;
  int *in_RSI;
  long in_RDI;
  bool local_1;
  
  std::__cxx11::string::operator=(in_RDX,"");
  if (*(char *)(in_RDI + *in_RSI) == '\0') {
    local_1 = false;
  }
  else {
    while (*(char *)(in_RDI + *in_RSI) != '\n') {
      iVar1 = *in_RSI;
      *in_RSI = iVar1 + 1;
      std::__cxx11::string::operator+=(in_RDX,*(char *)(in_RDI + iVar1));
    }
    *in_RSI = *in_RSI + 1;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool getLine(char* buff, int& buff_p, string& line){
    line = "";
    if(buff[buff_p] == 0) return false;
    while(buff[buff_p] != '\n'){
        line += buff[buff_p++];
    }
    buff_p++;
    return true;
}